

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O3

void __thiscall fasttext::QuantMatrix::load(QuantMatrix *this,istream *in)

{
  pointer puVar1;
  pointer puVar2;
  ProductQuantizer *pPVar3;
  _Head_base<0UL,_fasttext::ProductQuantizer_*,_false> _Var4;
  allocator_type local_49;
  undefined1 local_48 [16];
  pointer local_38;
  
  std::istream::read((char *)in,(long)&this->qnorm_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).m_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).n_);
  std::istream::read((char *)in,(long)&this->codesize_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,(long)this->codesize_
             ,&local_49);
  puVar1 = (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48 = ZEXT816(0) << 0x20;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_38 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
  }
  std::istream::read((char *)in,
                     (long)(this->codes_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  _Var4._M_head_impl = (ProductQuantizer *)operator_new(0x50);
  (_Var4._M_head_impl)->nbits_ = 8;
  (_Var4._M_head_impl)->ksub_ = 0x100;
  (_Var4._M_head_impl)->max_points_per_cluster_ = 0x100;
  (_Var4._M_head_impl)->max_points_ = 0x10000;
  (_Var4._M_head_impl)->seed_ = 0x4d2;
  (_Var4._M_head_impl)->niter_ = 0x19;
  (_Var4._M_head_impl)->eps_ = 1e-07;
  *(pointer *)
   ((long)&((_Var4._M_head_impl)->centroids_).super__Vector_base<float,_std::allocator<float>_> +
   0x10) = (pointer)0x0;
  *(undefined1 (*) [16])
   &((_Var4._M_head_impl)->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data = ZEXT816(0) << 0x20;
  ((_Var4._M_head_impl)->rng)._M_x = 1;
  pPVar3 = (this->pq_)._M_t.
           super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           ._M_t.
           super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
           .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
  (this->pq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (pPVar3 != (ProductQuantizer *)0x0) {
    std::default_delete<fasttext::ProductQuantizer>::operator()
              ((default_delete<fasttext::ProductQuantizer> *)&this->pq_,pPVar3);
    _Var4._M_head_impl =
         (this->pq_)._M_t.
         super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
         ._M_t.
         super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
         .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
  }
  ProductQuantizer::load(_Var4._M_head_impl,in);
  if (this->qnorm_ == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
               (this->super_Matrix).m_,&local_49);
    puVar1 = (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
    (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
    local_48 = ZEXT816(0) << 0x20;
    (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_38 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      if ((pointer)local_48._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
      }
    }
    std::istream::read((char *)in,
                       (long)(this->norm_codes_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    _Var4._M_head_impl = (ProductQuantizer *)operator_new(0x50);
    (_Var4._M_head_impl)->nbits_ = 8;
    (_Var4._M_head_impl)->ksub_ = 0x100;
    (_Var4._M_head_impl)->max_points_per_cluster_ = 0x100;
    (_Var4._M_head_impl)->max_points_ = 0x10000;
    (_Var4._M_head_impl)->seed_ = 0x4d2;
    (_Var4._M_head_impl)->niter_ = 0x19;
    (_Var4._M_head_impl)->eps_ = 1e-07;
    *(pointer *)
     ((long)&((_Var4._M_head_impl)->centroids_).super__Vector_base<float,_std::allocator<float>_> +
     0x10) = (pointer)0x0;
    *(undefined1 (*) [16])
     &((_Var4._M_head_impl)->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data = ZEXT816(0) << 0x20;
    ((_Var4._M_head_impl)->rng)._M_x = 1;
    pPVar3 = (this->npq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
    (this->npq_)._M_t.
    super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
    ._M_t.
    super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
    .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (pPVar3 != (ProductQuantizer *)0x0) {
      std::default_delete<fasttext::ProductQuantizer>::operator()
                ((default_delete<fasttext::ProductQuantizer> *)&this->npq_,pPVar3);
      _Var4._M_head_impl =
           (this->npq_)._M_t.
           super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           ._M_t.
           super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
           .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl;
    }
    ProductQuantizer::load(_Var4._M_head_impl,in);
  }
  return;
}

Assistant:

void QuantMatrix::load(std::istream& in) {
  in.read((char*)&qnorm_, sizeof(qnorm_));
  in.read((char*)&m_, sizeof(m_));
  in.read((char*)&n_, sizeof(n_));
  in.read((char*)&codesize_, sizeof(codesize_));
  codes_ = std::vector<uint8_t>(codesize_);
  in.read((char*)codes_.data(), codesize_ * sizeof(uint8_t));
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
  pq_->load(in);
  if (qnorm_) {
    norm_codes_ = std::vector<uint8_t>(m_);
    in.read((char*)norm_codes_.data(), m_ * sizeof(uint8_t));
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
    npq_->load(in);
  }
}